

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

bool __thiscall ImplicitDepLoader::LoadDeps(ImplicitDepLoader *this,Edge *edge,string *err)

{
  bool bVar1;
  string *err_00;
  string depfile;
  string deps_type;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"deps",&local_59);
  Edge::GetBinding(&local_38,edge,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (local_38._M_string_length == 0) {
    Edge::GetUnescapedDepfile_abi_cxx11_(&local_58,edge);
    if (local_58._M_string_length == 0) {
      bVar1 = true;
    }
    else {
      bVar1 = LoadDepFile(this,edge,&local_58,err);
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    bVar1 = LoadDepsFromLog(this,edge,err_00);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool ImplicitDepLoader::LoadDeps(Edge* edge, string* err) {
  string deps_type = edge->GetBinding("deps");
  if (!deps_type.empty())
    return LoadDepsFromLog(edge, err);

  string depfile = edge->GetUnescapedDepfile();
  if (!depfile.empty())
    return LoadDepFile(edge, depfile, err);

  // No deps to load.
  return true;
}